

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# realloc_unittest.cc
# Opt level: O1

void __thiscall ReallocUnittest_Basics_Test::TestBody(ReallocUnittest_Basics_Test *this)

{
  _Alloc_hider __ptr;
  uint uVar1;
  void *pvVar2;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  char *in_R9;
  ulong __size;
  int i;
  uint uVar9;
  uint uVar10;
  size_t __size_00;
  int i_1;
  uint uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar30;
  undefined1 auVar27 [16];
  int iVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar64;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar65;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar66;
  int iVar80;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  AssertHelper local_70;
  int sum;
  AssertionResult gtest_ar;
  Message local_48;
  AssertionResult gtest_ar_;
  
  uVar1 = 0;
  uVar8 = 0;
  do {
    __size = (ulong)uVar8;
    lVar6 = __size - 1;
    auVar13._8_4_ = (int)lVar6;
    auVar13._0_8_ = lVar6;
    auVar13._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar11 = 0;
    __size_00 = 0;
    do {
      pvVar2 = malloc(__size);
      auVar87._8_4_ = 0xffffffff;
      auVar87._0_8_ = 0xffffffffffffffff;
      auVar87._12_4_ = 0xffffffff;
      if (__size != 0) {
        uVar5 = 0;
        auVar42 = _DAT_00138080;
        auVar51 = _DAT_00138070;
        auVar73 = _DAT_00138060;
        auVar17 = _DAT_00138050;
        auVar19 = _DAT_00138040;
        auVar21 = _DAT_00138030;
        auVar23 = _DAT_00138020;
        auVar25 = _DAT_00138010;
        do {
          auVar27 = auVar13 ^ _DAT_00138090;
          auVar32 = auVar42 ^ _DAT_00138090;
          iVar64 = auVar27._0_4_;
          iVar66 = -(uint)(iVar64 < auVar32._0_4_);
          iVar65 = auVar27._4_4_;
          auVar33._4_4_ = -(uint)(iVar65 < auVar32._4_4_);
          iVar30 = auVar27._8_4_;
          iVar80 = -(uint)(iVar30 < auVar32._8_4_);
          iVar31 = auVar27._12_4_;
          auVar33._12_4_ = -(uint)(iVar31 < auVar32._12_4_);
          auVar45._4_4_ = iVar66;
          auVar45._0_4_ = iVar66;
          auVar45._8_4_ = iVar80;
          auVar45._12_4_ = iVar80;
          auVar81 = pshuflw(in_XMM12,auVar45,0xe8);
          auVar27._4_4_ = -(uint)(auVar32._4_4_ == iVar65);
          auVar27._12_4_ = -(uint)(auVar32._12_4_ == iVar31);
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar86 = pshuflw(in_XMM13,auVar27,0xe8);
          auVar33._0_4_ = auVar33._4_4_;
          auVar33._8_4_ = auVar33._12_4_;
          auVar32 = pshuflw(auVar81,auVar33,0xe8);
          auVar32 = (auVar32 | auVar86 & auVar81) ^ auVar87;
          auVar32 = packssdw(auVar32,auVar32);
          cVar4 = (char)uVar5;
          if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar2 + uVar5) = cVar4;
          }
          auVar33 = auVar27 & auVar45 | auVar33;
          auVar27 = packssdw(auVar33,auVar33);
          auVar27 = packssdw(auVar27 ^ auVar87,auVar27 ^ auVar87);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27._0_4_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 1) = cVar4 + '\x01';
          }
          auVar27 = auVar51 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar27._0_4_);
          auVar67._4_4_ = -(uint)(iVar65 < auVar27._4_4_);
          iVar80 = -(uint)(iVar30 < auVar27._8_4_);
          auVar67._12_4_ = -(uint)(iVar31 < auVar27._12_4_);
          auVar32._4_4_ = iVar66;
          auVar32._0_4_ = iVar66;
          auVar32._8_4_ = iVar80;
          auVar32._12_4_ = iVar80;
          auVar44._4_4_ = -(uint)(auVar27._4_4_ == iVar65);
          auVar44._12_4_ = -(uint)(auVar27._12_4_ == iVar31);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar27 = auVar44 & auVar32 | auVar67;
          auVar27 = packssdw(auVar27,auVar27);
          auVar27 = packssdw(auVar27 ^ auVar87,auVar27 ^ auVar87);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27._0_4_ >> 0x10 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 2) = cVar4 + '\x02';
          }
          auVar32 = pshufhw(auVar32,auVar32,0x84);
          auVar45 = pshufhw(auVar44,auVar44,0x84);
          auVar33 = pshufhw(auVar32,auVar67,0x84);
          auVar32 = (auVar33 | auVar45 & auVar32) ^ auVar87;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._0_4_ >> 0x18 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 3) = cVar4 + '\x03';
          }
          auVar32 = auVar73 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar32._0_4_);
          auVar35._4_4_ = -(uint)(iVar65 < auVar32._4_4_);
          iVar80 = -(uint)(iVar30 < auVar32._8_4_);
          auVar35._12_4_ = -(uint)(iVar31 < auVar32._12_4_);
          auVar46._4_4_ = iVar66;
          auVar46._0_4_ = iVar66;
          auVar46._8_4_ = iVar80;
          auVar46._12_4_ = iVar80;
          auVar27 = pshuflw(auVar27,auVar46,0xe8);
          auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar65);
          auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar31);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar33 = pshuflw(auVar86 & auVar81,auVar34,0xe8);
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar32 = pshuflw(auVar27,auVar35,0xe8);
          auVar32 = (auVar32 | auVar33 & auVar27) ^ auVar87;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar2 + uVar5 + 4) = cVar4 + '\x04';
          }
          auVar35 = auVar34 & auVar46 | auVar35;
          auVar32 = packssdw(auVar35,auVar35);
          auVar32 = packssdw(auVar32 ^ auVar87,auVar32 ^ auVar87);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32._4_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 5) = cVar4 + '\x05';
          }
          auVar32 = auVar17 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar32._0_4_);
          auVar68._4_4_ = -(uint)(iVar65 < auVar32._4_4_);
          iVar80 = -(uint)(iVar30 < auVar32._8_4_);
          auVar68._12_4_ = -(uint)(iVar31 < auVar32._12_4_);
          auVar81._4_4_ = iVar66;
          auVar81._0_4_ = iVar66;
          auVar81._8_4_ = iVar80;
          auVar81._12_4_ = iVar80;
          auVar86._4_4_ = -(uint)(auVar32._4_4_ == iVar65);
          auVar86._12_4_ = -(uint)(auVar32._12_4_ == iVar31);
          auVar86._0_4_ = auVar86._4_4_;
          auVar86._8_4_ = auVar86._12_4_;
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar32 = auVar86 & auVar81 | auVar68;
          auVar32 = packssdw(auVar32,auVar32);
          auVar32 = packssdw(auVar32 ^ auVar87,auVar32 ^ auVar87);
          auVar32 = packsswb(auVar32,auVar32);
          if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar2 + uVar5 + 6) = cVar4 + '\x06';
          }
          auVar45 = pshufhw(auVar81,auVar81,0x84);
          auVar86 = pshufhw(auVar86,auVar86,0x84);
          auVar81 = pshufhw(auVar45,auVar68,0x84);
          auVar45 = (auVar81 | auVar86 & auVar45) ^ auVar87;
          auVar45 = packssdw(auVar45,auVar45);
          auVar45 = packsswb(auVar45,auVar45);
          if ((auVar45._6_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 7) = cVar4 + '\a';
          }
          auVar45 = auVar19 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar45._0_4_);
          auVar37._4_4_ = -(uint)(iVar65 < auVar45._4_4_);
          iVar80 = -(uint)(iVar30 < auVar45._8_4_);
          auVar37._12_4_ = -(uint)(iVar31 < auVar45._12_4_);
          auVar47._4_4_ = iVar66;
          auVar47._0_4_ = iVar66;
          auVar47._8_4_ = iVar80;
          auVar47._12_4_ = iVar80;
          auVar32 = pshuflw(auVar32,auVar47,0xe8);
          auVar36._4_4_ = -(uint)(auVar45._4_4_ == iVar65);
          auVar36._12_4_ = -(uint)(auVar45._12_4_ == iVar31);
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar33 = pshuflw(auVar33 & auVar27,auVar36,0xe8);
          auVar37._0_4_ = auVar37._4_4_;
          auVar37._8_4_ = auVar37._12_4_;
          auVar27 = pshuflw(auVar32,auVar37,0xe8);
          auVar27 = (auVar27 | auVar33 & auVar32) ^ auVar87;
          auVar27 = packssdw(auVar27,auVar27);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar2 + uVar5 + 8) = cVar4 + '\b';
          }
          auVar37 = auVar36 & auVar47 | auVar37;
          auVar27 = packssdw(auVar37,auVar37);
          auVar27 = packssdw(auVar27 ^ auVar87,auVar27 ^ auVar87);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27._8_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 9) = cVar4 + '\t';
          }
          auVar27 = auVar21 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar27._0_4_);
          auVar69._4_4_ = -(uint)(iVar65 < auVar27._4_4_);
          iVar80 = -(uint)(iVar30 < auVar27._8_4_);
          auVar69._12_4_ = -(uint)(iVar31 < auVar27._12_4_);
          auVar38._4_4_ = iVar66;
          auVar38._0_4_ = iVar66;
          auVar38._8_4_ = iVar80;
          auVar38._12_4_ = iVar80;
          auVar48._4_4_ = -(uint)(auVar27._4_4_ == iVar65);
          auVar48._12_4_ = -(uint)(auVar27._12_4_ == iVar31);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar27 = auVar48 & auVar38 | auVar69;
          auVar27 = packssdw(auVar27,auVar27);
          auVar27 = packssdw(auVar27 ^ auVar87,auVar27 ^ auVar87);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar2 + uVar5 + 10) = cVar4 + '\n';
          }
          auVar45 = pshufhw(auVar38,auVar38,0x84);
          auVar86 = pshufhw(auVar48,auVar48,0x84);
          auVar81 = pshufhw(auVar45,auVar69,0x84);
          auVar45 = (auVar81 | auVar86 & auVar45) ^ auVar87;
          auVar45 = packssdw(auVar45,auVar45);
          auVar45 = packsswb(auVar45,auVar45);
          if ((auVar45._10_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 0xb) = cVar4 + '\v';
          }
          auVar45 = auVar23 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar45._0_4_);
          auVar40._4_4_ = -(uint)(iVar65 < auVar45._4_4_);
          iVar80 = -(uint)(iVar30 < auVar45._8_4_);
          auVar40._12_4_ = -(uint)(iVar31 < auVar45._12_4_);
          auVar49._4_4_ = iVar66;
          auVar49._0_4_ = iVar66;
          auVar49._8_4_ = iVar80;
          auVar49._12_4_ = iVar80;
          auVar27 = pshuflw(auVar27,auVar49,0xe8);
          auVar39._4_4_ = -(uint)(auVar45._4_4_ == iVar65);
          auVar39._12_4_ = -(uint)(auVar45._12_4_ == iVar31);
          auVar39._0_4_ = auVar39._4_4_;
          auVar39._8_4_ = auVar39._12_4_;
          in_XMM13 = pshuflw(auVar33 & auVar32,auVar39,0xe8);
          in_XMM13 = in_XMM13 & auVar27;
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar27 = pshuflw(auVar27,auVar40,0xe8);
          auVar27 = (auVar27 | in_XMM13) ^ auVar87;
          auVar27 = packssdw(auVar27,auVar27);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar2 + uVar5 + 0xc) = cVar4 + '\f';
          }
          auVar40 = auVar39 & auVar49 | auVar40;
          auVar27 = packssdw(auVar40,auVar40);
          auVar27 = packssdw(auVar27 ^ auVar87,auVar27 ^ auVar87);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27._12_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 0xd) = cVar4 + '\r';
          }
          auVar27 = auVar25 ^ _DAT_00138090;
          auVar70._0_4_ = -(uint)(iVar64 < auVar27._0_4_);
          auVar70._4_4_ = -(uint)(iVar65 < auVar27._4_4_);
          auVar70._8_4_ = -(uint)(iVar30 < auVar27._8_4_);
          auVar70._12_4_ = -(uint)(iVar31 < auVar27._12_4_);
          auVar41._4_4_ = auVar70._0_4_;
          auVar41._0_4_ = auVar70._0_4_;
          auVar41._8_4_ = auVar70._8_4_;
          auVar41._12_4_ = auVar70._8_4_;
          iVar64 = -(uint)(auVar27._4_4_ == iVar65);
          iVar65 = -(uint)(auVar27._12_4_ == iVar31);
          auVar28._4_4_ = iVar64;
          auVar28._0_4_ = iVar64;
          auVar28._8_4_ = iVar65;
          auVar28._12_4_ = iVar65;
          auVar50._4_4_ = auVar70._4_4_;
          auVar50._0_4_ = auVar70._4_4_;
          auVar50._8_4_ = auVar70._12_4_;
          auVar50._12_4_ = auVar70._12_4_;
          in_XMM12 = auVar28 & auVar41 | auVar50;
          auVar27 = packssdw(auVar70,in_XMM12);
          auVar27 = packssdw(auVar27 ^ auVar87,auVar27 ^ auVar87);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)pvVar2 + uVar5 + 0xe) = cVar4 + '\x0e';
          }
          auVar32 = pshufhw(auVar41,auVar41,0x84);
          auVar27 = pshufhw(auVar28,auVar28,0x84);
          auVar33 = pshufhw(auVar32,auVar50,0x84);
          auVar27 = packssdw(auVar27 & auVar32,(auVar33 | auVar27 & auVar32) ^ auVar87);
          auVar27 = packsswb(auVar27,auVar27);
          if ((auVar27._14_2_ >> 8 & 1) != 0) {
            *(char *)((long)pvVar2 + uVar5 + 0xf) = cVar4 + '\x0f';
          }
          uVar5 = uVar5 + 0x10;
          lVar6 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + 0x10;
          auVar42._8_8_ = lVar6 + 0x10;
          lVar6 = auVar51._8_8_;
          auVar51._0_8_ = auVar51._0_8_ + 0x10;
          auVar51._8_8_ = lVar6 + 0x10;
          lVar6 = auVar73._8_8_;
          auVar73._0_8_ = auVar73._0_8_ + 0x10;
          auVar73._8_8_ = lVar6 + 0x10;
          lVar6 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 0x10;
          auVar17._8_8_ = lVar6 + 0x10;
          lVar6 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 0x10;
          auVar19._8_8_ = lVar6 + 0x10;
          lVar6 = auVar21._8_8_;
          auVar21._0_8_ = auVar21._0_8_ + 0x10;
          auVar21._8_8_ = lVar6 + 0x10;
          lVar6 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 0x10;
          auVar23._8_8_ = lVar6 + 0x10;
          lVar6 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 0x10;
          auVar25._8_8_ = lVar6 + 0x10;
        } while ((uVar8 + 0xf & 0xfffffff0) != uVar5);
      }
      uVar9 = (uint)__size_00;
      pcVar3 = (char *)realloc(pvVar2,__size_00);
      uVar10 = uVar8;
      if ((int)uVar9 < (int)uVar8) {
        uVar10 = uVar9;
      }
      bVar12 = uVar10 == 0;
      if (!bVar12) {
        if (*pcVar3 == '\0') {
          uVar5 = 1;
          do {
            uVar7 = uVar5;
            if (uVar10 == uVar7) break;
            uVar5 = uVar7 + 1;
          } while ((char)((char)(uVar7 + 1) + -1) == pcVar3[uVar7]);
          bVar12 = uVar10 <= uVar7;
        }
        else {
          bVar12 = false;
        }
      }
      local_48.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_48.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,bVar12);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (bVar12 == false) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&sum,(internal *)&local_48,
                   (AssertionResult *)"Valid(dst, std::min(src_size, dst_size))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/realloc_unittest.cc"
                   ,0x60,_sum);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)_sum != &gtest_ar.message_) {
          operator_delete(_sum,(long)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl + 1);
        }
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (gtest_ar_._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_._0_8_);
        }
LAB_00109494:
        if (uVar11 == 0) {
          if (uVar1 == 0) {
            return;
          }
          goto LAB_001094f5;
        }
        break;
      }
      if (uVar9 != 0) {
        lVar6 = __size_00 - 1;
        auVar14._8_4_ = (int)lVar6;
        auVar14._0_8_ = lVar6;
        auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
        uVar5 = 0;
        auVar15 = _DAT_00138080;
        auVar16 = _DAT_00138070;
        auVar18 = _DAT_00138060;
        auVar20 = _DAT_00138050;
        auVar22 = _DAT_00138040;
        auVar24 = _DAT_00138030;
        auVar26 = _DAT_00138020;
        auVar29 = _DAT_00138010;
        do {
          auVar42 = auVar14 ^ _DAT_00138090;
          auVar51 = auVar15 ^ _DAT_00138090;
          iVar64 = auVar42._0_4_;
          iVar66 = -(uint)(iVar64 < auVar51._0_4_);
          iVar65 = auVar42._4_4_;
          auVar53._4_4_ = -(uint)(iVar65 < auVar51._4_4_);
          iVar30 = auVar42._8_4_;
          iVar80 = -(uint)(iVar30 < auVar51._8_4_);
          iVar31 = auVar42._12_4_;
          auVar53._12_4_ = -(uint)(iVar31 < auVar51._12_4_);
          auVar71._4_4_ = iVar66;
          auVar71._0_4_ = iVar66;
          auVar71._8_4_ = iVar80;
          auVar71._12_4_ = iVar80;
          auVar42 = pshuflw(in_XMM13,auVar71,0xe8);
          auVar52._4_4_ = -(uint)(auVar51._4_4_ == iVar65);
          auVar52._12_4_ = -(uint)(auVar51._12_4_ == iVar31);
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          auVar51 = pshuflw(auVar87,auVar52,0xe8);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar87 = pshuflw(auVar42,auVar53,0xe8);
          auVar88._8_4_ = 0xffffffff;
          auVar88._0_8_ = 0xffffffffffffffff;
          auVar88._12_4_ = 0xffffffff;
          auVar87 = (auVar87 | auVar51 & auVar42) ^ auVar88;
          auVar87 = packssdw(auVar87,auVar87);
          cVar4 = (char)uVar5;
          if ((auVar87 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar3[uVar5] = cVar4;
          }
          auVar53 = auVar52 & auVar71 | auVar53;
          auVar87 = packssdw(auVar53,auVar53);
          auVar87 = packssdw(auVar87 ^ auVar88,auVar87 ^ auVar88);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87._0_4_ >> 8 & 1) != 0) {
            pcVar3[uVar5 + 1] = cVar4 + '\x01';
          }
          auVar87 = auVar16 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar87._0_4_);
          auVar82._4_4_ = -(uint)(iVar65 < auVar87._4_4_);
          iVar80 = -(uint)(iVar30 < auVar87._8_4_);
          auVar82._12_4_ = -(uint)(iVar31 < auVar87._12_4_);
          auVar54._4_4_ = iVar66;
          auVar54._0_4_ = iVar66;
          auVar54._8_4_ = iVar80;
          auVar54._12_4_ = iVar80;
          auVar72._4_4_ = -(uint)(auVar87._4_4_ == iVar65);
          auVar72._12_4_ = -(uint)(auVar87._12_4_ == iVar31);
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar82._0_4_ = auVar82._4_4_;
          auVar82._8_4_ = auVar82._12_4_;
          auVar87 = auVar72 & auVar54 | auVar82;
          auVar87 = packssdw(auVar87,auVar87);
          auVar87 = packssdw(auVar87 ^ auVar88,auVar87 ^ auVar88);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87._0_4_ >> 0x10 & 1) != 0) {
            pcVar3[uVar5 + 2] = cVar4 + '\x02';
          }
          auVar42 = pshufhw(auVar54,auVar54,0x84);
          auVar73 = pshufhw(auVar72,auVar72,0x84);
          auVar51 = pshufhw(auVar42,auVar82,0x84);
          auVar42 = (auVar51 | auVar73 & auVar42) ^ auVar88;
          auVar42 = packssdw(auVar42,auVar42);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._0_4_ >> 0x18 & 1) != 0) {
            pcVar3[uVar5 + 3] = cVar4 + '\x03';
          }
          auVar42 = auVar18 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar42._0_4_);
          auVar56._4_4_ = -(uint)(iVar65 < auVar42._4_4_);
          iVar80 = -(uint)(iVar30 < auVar42._8_4_);
          auVar56._12_4_ = -(uint)(iVar31 < auVar42._12_4_);
          auVar74._4_4_ = iVar66;
          auVar74._0_4_ = iVar66;
          auVar74._8_4_ = iVar80;
          auVar74._12_4_ = iVar80;
          auVar87 = pshuflw(auVar87,auVar74,0xe8);
          auVar55._4_4_ = -(uint)(auVar42._4_4_ == iVar65);
          auVar55._12_4_ = -(uint)(auVar42._12_4_ == iVar31);
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar51 = pshuflw(auVar88,auVar55,0xe8);
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar42 = pshuflw(auVar87,auVar56,0xe8);
          auVar89._8_4_ = 0xffffffff;
          auVar89._0_8_ = 0xffffffffffffffff;
          auVar89._12_4_ = 0xffffffff;
          auVar87 = (auVar42 | auVar51 & auVar87) ^ auVar89;
          auVar87 = packssdw(auVar87,auVar87);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar3[uVar5 + 4] = cVar4 + '\x04';
          }
          auVar56 = auVar55 & auVar74 | auVar56;
          auVar87 = packssdw(auVar56,auVar56);
          auVar87 = packssdw(auVar87 ^ auVar89,auVar87 ^ auVar89);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87._4_2_ >> 8 & 1) != 0) {
            pcVar3[uVar5 + 5] = cVar4 + '\x05';
          }
          auVar87 = auVar20 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar87._0_4_);
          auVar83._4_4_ = -(uint)(iVar65 < auVar87._4_4_);
          iVar80 = -(uint)(iVar30 < auVar87._8_4_);
          auVar83._12_4_ = -(uint)(iVar31 < auVar87._12_4_);
          auVar57._4_4_ = iVar66;
          auVar57._0_4_ = iVar66;
          auVar57._8_4_ = iVar80;
          auVar57._12_4_ = iVar80;
          auVar75._4_4_ = -(uint)(auVar87._4_4_ == iVar65);
          auVar75._12_4_ = -(uint)(auVar87._12_4_ == iVar31);
          auVar75._0_4_ = auVar75._4_4_;
          auVar75._8_4_ = auVar75._12_4_;
          auVar83._0_4_ = auVar83._4_4_;
          auVar83._8_4_ = auVar83._12_4_;
          auVar87 = auVar75 & auVar57 | auVar83;
          auVar87 = packssdw(auVar87,auVar87);
          auVar87 = packssdw(auVar87 ^ auVar89,auVar87 ^ auVar89);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar3[uVar5 + 6] = cVar4 + '\x06';
          }
          auVar42 = pshufhw(auVar57,auVar57,0x84);
          auVar73 = pshufhw(auVar75,auVar75,0x84);
          auVar51 = pshufhw(auVar42,auVar83,0x84);
          auVar42 = (auVar51 | auVar73 & auVar42) ^ auVar89;
          auVar42 = packssdw(auVar42,auVar42);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._6_2_ >> 8 & 1) != 0) {
            pcVar3[uVar5 + 7] = cVar4 + '\a';
          }
          auVar42 = auVar22 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar42._0_4_);
          auVar59._4_4_ = -(uint)(iVar65 < auVar42._4_4_);
          iVar80 = -(uint)(iVar30 < auVar42._8_4_);
          auVar59._12_4_ = -(uint)(iVar31 < auVar42._12_4_);
          auVar76._4_4_ = iVar66;
          auVar76._0_4_ = iVar66;
          auVar76._8_4_ = iVar80;
          auVar76._12_4_ = iVar80;
          auVar87 = pshuflw(auVar87,auVar76,0xe8);
          auVar58._4_4_ = -(uint)(auVar42._4_4_ == iVar65);
          auVar58._12_4_ = -(uint)(auVar42._12_4_ == iVar31);
          auVar58._0_4_ = auVar58._4_4_;
          auVar58._8_4_ = auVar58._12_4_;
          auVar51 = pshuflw(auVar89,auVar58,0xe8);
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          auVar42 = pshuflw(auVar87,auVar59,0xe8);
          auVar90._8_4_ = 0xffffffff;
          auVar90._0_8_ = 0xffffffffffffffff;
          auVar90._12_4_ = 0xffffffff;
          auVar87 = (auVar42 | auVar51 & auVar87) ^ auVar90;
          auVar87 = packssdw(auVar87,auVar87);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar3[uVar5 + 8] = cVar4 + '\b';
          }
          auVar59 = auVar58 & auVar76 | auVar59;
          auVar87 = packssdw(auVar59,auVar59);
          auVar87 = packssdw(auVar87 ^ auVar90,auVar87 ^ auVar90);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87._8_2_ >> 8 & 1) != 0) {
            pcVar3[uVar5 + 9] = cVar4 + '\t';
          }
          auVar87 = auVar24 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar87._0_4_);
          auVar84._4_4_ = -(uint)(iVar65 < auVar87._4_4_);
          iVar80 = -(uint)(iVar30 < auVar87._8_4_);
          auVar84._12_4_ = -(uint)(iVar31 < auVar87._12_4_);
          auVar60._4_4_ = iVar66;
          auVar60._0_4_ = iVar66;
          auVar60._8_4_ = iVar80;
          auVar60._12_4_ = iVar80;
          auVar77._4_4_ = -(uint)(auVar87._4_4_ == iVar65);
          auVar77._12_4_ = -(uint)(auVar87._12_4_ == iVar31);
          auVar77._0_4_ = auVar77._4_4_;
          auVar77._8_4_ = auVar77._12_4_;
          auVar84._0_4_ = auVar84._4_4_;
          auVar84._8_4_ = auVar84._12_4_;
          auVar87 = auVar77 & auVar60 | auVar84;
          auVar87 = packssdw(auVar87,auVar87);
          auVar87 = packssdw(auVar87 ^ auVar90,auVar87 ^ auVar90);
          auVar87 = packsswb(auVar87,auVar87);
          if ((auVar87 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pcVar3[uVar5 + 10] = cVar4 + '\n';
          }
          auVar42 = pshufhw(auVar60,auVar60,0x84);
          auVar73 = pshufhw(auVar77,auVar77,0x84);
          auVar51 = pshufhw(auVar42,auVar84,0x84);
          auVar42 = (auVar51 | auVar73 & auVar42) ^ auVar90;
          auVar42 = packssdw(auVar42,auVar42);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._10_2_ >> 8 & 1) != 0) {
            pcVar3[uVar5 + 0xb] = cVar4 + '\v';
          }
          auVar42 = auVar26 ^ _DAT_00138090;
          iVar66 = -(uint)(iVar64 < auVar42._0_4_);
          auVar62._4_4_ = -(uint)(iVar65 < auVar42._4_4_);
          iVar80 = -(uint)(iVar30 < auVar42._8_4_);
          auVar62._12_4_ = -(uint)(iVar31 < auVar42._12_4_);
          auVar78._4_4_ = iVar66;
          auVar78._0_4_ = iVar66;
          auVar78._8_4_ = iVar80;
          auVar78._12_4_ = iVar80;
          auVar51 = pshuflw(auVar87,auVar78,0xe8);
          auVar61._4_4_ = -(uint)(auVar42._4_4_ == iVar65);
          auVar61._12_4_ = -(uint)(auVar42._12_4_ == iVar31);
          auVar61._0_4_ = auVar61._4_4_;
          auVar61._8_4_ = auVar61._12_4_;
          auVar73 = pshuflw(auVar90,auVar61,0xe8);
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar42 = pshuflw(auVar51,auVar62,0xe8);
          auVar87._8_4_ = 0xffffffff;
          auVar87._0_8_ = 0xffffffffffffffff;
          auVar87._12_4_ = 0xffffffff;
          auVar42 = (auVar42 | auVar73 & auVar51) ^ auVar87;
          auVar42 = packssdw(auVar42,auVar42);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar3[uVar5 + 0xc] = cVar4 + '\f';
          }
          auVar62 = auVar61 & auVar78 | auVar62;
          auVar42 = packssdw(auVar62,auVar62);
          auVar42 = packssdw(auVar42 ^ auVar87,auVar42 ^ auVar87);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._12_2_ >> 8 & 1) != 0) {
            pcVar3[uVar5 + 0xd] = cVar4 + '\r';
          }
          auVar42 = auVar29 ^ _DAT_00138090;
          auVar85._0_4_ = -(uint)(iVar64 < auVar42._0_4_);
          auVar85._4_4_ = -(uint)(iVar65 < auVar42._4_4_);
          auVar85._8_4_ = -(uint)(iVar30 < auVar42._8_4_);
          auVar85._12_4_ = -(uint)(iVar31 < auVar42._12_4_);
          auVar63._4_4_ = auVar85._0_4_;
          auVar63._0_4_ = auVar85._0_4_;
          auVar63._8_4_ = auVar85._8_4_;
          auVar63._12_4_ = auVar85._8_4_;
          iVar64 = -(uint)(auVar42._4_4_ == iVar65);
          iVar65 = -(uint)(auVar42._12_4_ == iVar31);
          auVar43._4_4_ = iVar64;
          auVar43._0_4_ = iVar64;
          auVar43._8_4_ = iVar65;
          auVar43._12_4_ = iVar65;
          auVar79._4_4_ = auVar85._4_4_;
          auVar79._0_4_ = auVar85._4_4_;
          auVar79._8_4_ = auVar85._12_4_;
          auVar79._12_4_ = auVar85._12_4_;
          in_XMM13 = auVar43 & auVar63 | auVar79;
          auVar42 = packssdw(auVar85,in_XMM13);
          auVar42 = packssdw(auVar42 ^ auVar87,auVar42 ^ auVar87);
          in_XMM12 = packsswb(auVar42,auVar42);
          if ((in_XMM12 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar3[uVar5 + 0xe] = cVar4 + '\x0e';
          }
          auVar51 = pshufhw(auVar63,auVar63,0x84);
          auVar42 = pshufhw(auVar43,auVar43,0x84);
          auVar73 = pshufhw(auVar51,auVar79,0x84);
          auVar42 = packssdw(auVar42 & auVar51,(auVar73 | auVar42 & auVar51) ^ auVar87);
          auVar42 = packsswb(auVar42,auVar42);
          if ((auVar42._14_2_ >> 8 & 1) != 0) {
            pcVar3[uVar5 + 0xf] = cVar4 + '\x0f';
          }
          uVar5 = uVar5 + 0x10;
          lVar6 = auVar15._8_8_;
          auVar15._0_8_ = auVar15._0_8_ + 0x10;
          auVar15._8_8_ = lVar6 + 0x10;
          lVar6 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 0x10;
          auVar16._8_8_ = lVar6 + 0x10;
          lVar6 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 0x10;
          auVar18._8_8_ = lVar6 + 0x10;
          lVar6 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 0x10;
          auVar20._8_8_ = lVar6 + 0x10;
          lVar6 = auVar22._8_8_;
          auVar22._0_8_ = auVar22._0_8_ + 0x10;
          auVar22._8_8_ = lVar6 + 0x10;
          lVar6 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 0x10;
          auVar24._8_8_ = lVar6 + 0x10;
          lVar6 = auVar26._8_8_;
          auVar26._0_8_ = auVar26._0_8_ + 0x10;
          auVar26._8_8_ = lVar6 + 0x10;
          lVar6 = auVar29._8_8_;
          auVar29._0_8_ = auVar29._0_8_ + 0x10;
          auVar29._8_8_ = lVar6 + 0x10;
        } while ((uVar9 + 0xf & 0xfffffff0) != uVar5);
      }
      bVar12 = uVar9 == 0;
      if (!bVar12) {
        if (*pcVar3 == '\0') {
          uVar5 = 1;
          do {
            uVar7 = uVar5;
            if (__size_00 == uVar7) break;
            uVar5 = uVar7 + 1;
          } while ((char)((char)(uVar7 + 1) + -1) == pcVar3[uVar7]);
          bVar12 = __size_00 <= uVar7;
        }
        else {
          bVar12 = false;
        }
      }
      local_48.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ =
           CONCAT31(local_48.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._1_3_,bVar12);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (bVar12 == false) {
        testing::Message::Message((Message *)&gtest_ar_.message_);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&sum,(internal *)&local_48,(AssertionResult *)"Valid(dst, dst_size)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/realloc_unittest.cc"
                   ,0x62,_sum);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)_sum != &gtest_ar.message_) {
          operator_delete(_sum,(long)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl + 1);
        }
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(long *)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl + 8))();
        }
        if (gtest_ar_._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_._0_8_);
        }
        goto LAB_00109494;
      }
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (pcVar3 != (char *)0x0) {
        free(pcVar3);
      }
      if (uVar9 < 100) {
        uVar10 = uVar9 + 1;
      }
      else {
        uVar10 = 0xffffffff;
        if (uVar9 < 100000) {
          iVar64 = 1;
          do {
            iVar65 = iVar64;
            iVar64 = iVar65 * 2;
          } while (iVar65 < (int)uVar9);
          uVar10 = iVar65 - 1;
          if ((int)uVar10 <= (int)uVar9) {
            uVar10 = iVar65 + (uint)(uVar10 != uVar9);
          }
        }
      }
      uVar11 = uVar10 >> 0x1f;
      __size_00 = (size_t)uVar10;
    } while (-1 < (int)uVar10);
    if (uVar8 < 100) {
      uVar1 = uVar8 + 1;
    }
    else {
      uVar1 = 0xffffffff;
      if (uVar8 < 100000) {
        iVar64 = 1;
        do {
          iVar65 = iVar64;
          iVar64 = iVar65 * 2;
        } while (iVar65 < (int)uVar8);
        uVar1 = iVar65 - 1;
        if ((int)uVar1 <= (int)uVar8) {
          uVar1 = iVar65 + (uint)(uVar1 != uVar8);
        }
      }
    }
    uVar8 = uVar1;
    uVar1 = uVar8 >> 0x1f;
    if ((int)uVar8 < 0) {
LAB_001094f5:
      _sum = (pointer)malloc(0x20000);
      (*noopt_helper)(&sum);
      __ptr._M_p = _sum;
      local_70.data_._0_4_ = 0;
      lVar6 = 0;
      do {
        pvVar2 = malloc(0x2000);
        *(void **)(__ptr._M_p + lVar6 * 8) = pvVar2;
        *(int *)((long)pvVar2 + 4000) = (int)lVar6;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x4000);
      lVar6 = 0;
      do {
        _sum = (pointer)realloc(*(void **)(__ptr._M_p + lVar6 * 8),9000);
        (*noopt_helper)(&sum);
        *(pointer *)(__ptr._M_p + lVar6 * 8) = _sum;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x4000);
      lVar6 = 0;
      do {
        local_70.data_._0_4_ =
             (int)local_70.data_ + *(int *)((long)*(void **)(__ptr._M_p + lVar6 * 8) + 4000);
        free(*(void **)(__ptr._M_p + lVar6 * 8));
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x4000);
      local_48.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = 0x7ffe000;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&sum,"kNumEntries/2 * (kNumEntries - 1)","sum",(int *)&local_48,
                 (int *)&local_70);
      if ((char)sum == '\0') {
        testing::Message::Message(&local_48);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/realloc_unittest.cc"
                   ,0x78,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_48);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
        if ((long *)CONCAT44(local_48.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_,
                             local_48.ss_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_48.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._4_4_,
                                         local_48.ss_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl._0_4_) + 8))();
        }
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
      }
      else {
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        free(__ptr._M_p);
      }
      return;
    }
  } while( true );
}

Assistant:

TEST(ReallocUnittest, Basics) {
  for (int src_size = 0; src_size >= 0; src_size = NextSize(src_size)) {
    for (int dst_size = 0; dst_size >= 0; dst_size = NextSize(dst_size)) {
      unsigned char* src = (unsigned char*) malloc(src_size);
      Fill(src, src_size);
      unsigned char* dst = (unsigned char*) realloc(src, dst_size);
      ASSERT_TRUE(Valid(dst, std::min(src_size, dst_size)));
      Fill(dst, dst_size);
      ASSERT_TRUE(Valid(dst, dst_size));
      if (dst != nullptr) free(dst);
    }
  }

  // Now make sure realloc works correctly even when we overflow the
  // packed cache, so some entries are evicted from the cache.
  // The cache has 2^12 entries, keyed by page number.
  const int kNumEntries = 1 << 14;
  int** p = (int**)noopt(malloc(sizeof(*p) * kNumEntries));
  int sum = 0;
  for (int i = 0; i < kNumEntries; i++) {
    p[i] = (int*)malloc(8192);   // no page size is likely to be bigger
    p[i][1000] = i;              // use memory deep in the heart of p
  }
  for (int i = 0; i < kNumEntries; i++) {
    p[i] = (int*)noopt(realloc(p[i], 9000));
  }
  for (int i = 0; i < kNumEntries; i++) {
    sum += p[i][1000];
    free(p[i]);
  }
  ASSERT_EQ(kNumEntries/2 * (kNumEntries - 1), sum);  // assume kNE is even
  free(p);
}